

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS ref_gather_node_metric(REF_NODE ref_node,FILE *file)

{
  REF_MPI pRVar1;
  FILE *__stream;
  uint uVar2;
  uint uVar3;
  REF_STATUS RVar4;
  void *__s;
  void *output;
  undefined8 *puVar5;
  undefined8 uVar6;
  REF_STATUS ref_private_macro_code_rxs;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  REF_INT local;
  uint local_68;
  int local_64;
  long local_60;
  ulong local_58;
  REF_MPI local_50;
  FILE *local_48;
  ulong local_40;
  ulong local_38;
  
  pRVar1 = ref_node->ref_mpi;
  lVar12 = ref_node->old_n_global;
  uVar2 = (int)(lVar12 / (long)pRVar1->n) + 1;
  uVar10 = 0x7fffffff;
  if (0 < pRVar1->reduce_byte_limit) {
    uVar10 = (ulong)((uint)pRVar1->reduce_byte_limit >> 3) / 7;
  }
  if (((int)uVar2 < (int)uVar10) && (uVar10 = (ulong)uVar2, (int)uVar2 < 0)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x509,
           "ref_gather_node_metric","malloc local_xyzm of REF_DBL negative");
    RVar4 = 1;
  }
  else {
    uVar2 = (int)uVar10 * 7;
    __s = malloc((ulong)uVar2 * 8);
    if (__s == (void *)0x0) {
      pcVar8 = "malloc local_xyzm of REF_DBL NULL";
      uVar6 = 0x509;
    }
    else {
      local_58 = uVar10;
      output = malloc((ulong)uVar2 * 8);
      if (output != (void *)0x0) {
        local_50 = pRVar1;
        if (0 < lVar12) {
          local_40 = local_58 & 0xffffffff;
          lVar11 = 0;
          local_48 = (FILE *)file;
          do {
            uVar10 = lVar12 - lVar11;
            if ((long)local_40 < lVar12 - lVar11) {
              uVar10 = local_58;
            }
            if ((int)local_58 != 0) {
              memset(__s,0,(ulong)(uVar2 + (uVar2 == 0)) << 3);
            }
            iVar9 = (int)uVar10;
            local_60 = lVar11;
            if (0 < iVar9) {
              local_38 = (uVar10 & 0xffffffff) * 0x38;
              uVar7 = 0;
              do {
                uVar3 = ref_node_local(ref_node,lVar11,&local_64);
                if ((uVar3 != 0) && (uVar3 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x519,"ref_gather_node_metric",(ulong)uVar3,"node local failed");
                  local_68 = uVar3;
                }
                if (uVar3 == 5) {
LAB_0014810d:
                  puVar5 = (undefined8 *)((uVar7 & 0x7fffffff8) + (long)__s);
                  puVar5[4] = 0;
                  puVar5[5] = 0;
                  puVar5[2] = 0;
                  puVar5[3] = 0;
                  *puVar5 = 0;
                  puVar5[1] = 0;
                  puVar5[6] = 0;
                }
                else {
                  if (uVar3 != 0) {
                    return local_68;
                  }
                  if (local_50->id != ref_node->part[local_64]) goto LAB_0014810d;
                  uVar3 = ref_node_metric_get(ref_node,local_64,(REF_DBL *)((long)__s + uVar7));
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x51c,"ref_gather_node_metric",(ulong)uVar3,"get");
                    return uVar3;
                  }
                  *(undefined8 *)((long)__s + uVar7 + 0x30) = 0x3ff0000000000000;
                }
                uVar7 = uVar7 + 0x38;
                lVar11 = lVar11 + 1;
              } while (local_38 != uVar7);
            }
            pRVar1 = local_50;
            uVar3 = ref_mpi_sum(local_50,__s,output,iVar9 * 7,3);
            __stream = local_48;
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x523,"ref_gather_node_metric",(ulong)uVar3,"sum");
              return uVar3;
            }
            if ((pRVar1->id == 0) && (0 < iVar9)) {
              lVar11 = 0;
              lVar12 = local_60;
              do {
                dVar13 = *(double *)((long)output + lVar11 + 0x30) + -1.0;
                if (dVar13 <= -dVar13) {
                  dVar13 = -dVar13;
                }
                if (0.1 < dVar13) {
                  printf("error gather node %ld %f\n",lVar12);
                }
                fprintf(__stream,"%.15e %.15e %.15e %.15e %.15e %.15e \n",
                        (int)*(undefined8 *)((long)output + lVar11),
                        *(undefined8 *)((long)output + lVar11 + 8),
                        *(undefined8 *)((long)output + lVar11 + 0x10),
                        *(undefined8 *)((long)output + lVar11 + 0x18),
                        *(undefined8 *)((long)output + lVar11 + 0x20),
                        *(undefined8 *)((long)output + lVar11 + 0x28));
                lVar11 = lVar11 + 0x38;
                lVar12 = lVar12 + 1;
              } while ((uVar10 & 0xffffffff) * 0x38 - lVar11 != 0);
            }
            lVar11 = local_60 + iVar9;
            lVar12 = ref_node->old_n_global;
          } while (lVar11 < lVar12);
        }
        free(output);
        free(__s);
        return 0;
      }
      pcVar8 = "malloc xyzm of REF_DBL NULL";
      uVar6 = 0x50a;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar6,
           "ref_gather_node_metric",pcVar8);
    RVar4 = 2;
  }
  return RVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_metric(REF_NODE ref_node,
                                                 FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im;
  REF_STATUS status;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(
      chunk, ref_mpi_reduce_chunk_limit(ref_mpi, 7 * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, 7 * chunk, REF_DBL);
  ref_malloc(xyzm, 7 * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;

    for (i = 0; i < 7 * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        RSS(ref_node_metric_get(ref_node, local, &(local_xyzm[7 * i])), "get");
        local_xyzm[6 + 7 * i] = 1.0;
      } else {
        for (im = 0; im < 7; im++) local_xyzm[im + 7 * i] = 0.0;
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, 7 * n, REF_DBL_TYPE), "sum");

    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[6 + 7 * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[6 + 7 * i]);
        }
        fprintf(file, "%.15e %.15e %.15e %.15e %.15e %.15e \n", xyzm[0 + 7 * i],
                xyzm[1 + 7 * i], xyzm[2 + 7 * i], xyzm[3 + 7 * i],
                xyzm[4 + 7 * i], xyzm[5 + 7 * i]);
      }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  return REF_SUCCESS;
}